

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O0

bool __thiscall
crnlib::clusterizer<crnlib::vec<16U,_float>_>::generate_codebook
          (clusterizer<crnlib::vec<16U,_float>_> *this,uint max_size,
          progress_callback_func_ptr pProgress_callback,void *pProgress_data,bool quick)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  pair<crnlib::vec<16U,_float>,_unsigned_int> *ppVar5;
  uint *puVar6;
  vq_node *obj;
  float fVar7;
  float local_17c;
  float local_174;
  vq_node *node;
  uint i_1;
  int cur_percentage;
  int worst_node_index;
  int prev_percentage;
  uint total_leaves;
  uint local_cc;
  pair<crnlib::vec<16U,_float>,_unsigned_int> *ppStack_c8;
  uint weight;
  vec<16U,_float> *v;
  uint i;
  undefined1 local_b0 [8];
  vq_node root;
  double ttsum;
  bool quick_local;
  void *pProgress_data_local;
  progress_callback_func_ptr pProgress_callback_local;
  uint max_size_local;
  clusterizer<crnlib::vec<16U,_float>_> *this_local;
  
  bVar2 = vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_>::empty(&this->m_training_vecs);
  if (bVar2) {
    return false;
  }
  this->m_quick = quick;
  root.m_codebook_index = 0;
  root.m_unsplittable = false;
  root._109_3_ = 0;
  vq_node::vq_node((vq_node *)local_b0);
  uVar3 = vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_>::size(&this->m_training_vecs);
  vector<unsigned_int>::reserve((vector<unsigned_int> *)&root.m_variance,uVar3);
  for (v._0_4_ = 0; uVar4 = (uint)v,
      uVar3 = vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_>::size
                        (&this->m_training_vecs), uVar1 = root._104_8_, uVar4 < uVar3;
      v._0_4_ = (uint)v + 1) {
    ppStack_c8 = vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_>::operator[]
                           (&this->m_training_vecs,(uint)v);
    ppVar5 = vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_>::operator[]
                       (&this->m_training_vecs,(uint)v);
    local_cc = ppVar5->second;
    crnlib::operator*((vec<16U,_float> *)&prev_percentage,&ppStack_c8->first,(float)local_cc);
    vec<16U,_float>::operator+=((vec<16U,_float> *)local_b0,(vec<16U,_float> *)&prev_percentage);
    root.m_centroid.m_s._56_8_ = root.m_centroid.m_s._56_8_ + (ulong)local_cc;
    vector<unsigned_int>::push_back((vector<unsigned_int> *)&root.m_variance,(uint *)&v);
    fVar7 = vec<16U,_float>::dot(&ppStack_c8->first,&ppStack_c8->first);
    root._104_8_ = (double)(fVar7 * (float)local_cc) + (double)root._104_8_;
  }
  fVar7 = vec<16U,_float>::dot((vec<16U,_float> *)local_b0,(vec<16U,_float> *)local_b0);
  local_174 = (float)(ulong)root.m_centroid.m_s._56_8_;
  root.m_total_weight._0_4_ = (float)((double)uVar1 - (double)(fVar7 / local_174));
  local_17c = (float)(ulong)root.m_centroid.m_s._56_8_;
  vec<16U,_float>::operator*=((vec<16U,_float> *)local_b0,1.0 / local_17c);
  vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node>::clear(&this->m_nodes);
  vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node>::reserve
            (&this->m_nodes,max_size * 2 + 1);
  vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node>::push_back
            (&this->m_nodes,(vq_node *)local_b0);
  vector<unsigned_int>::resize(&this->m_heap,max_size + 1,false);
  puVar6 = vector<unsigned_int>::operator[](&this->m_heap,1);
  *puVar6 = 0;
  this->m_heap_size = 1;
  this->m_split_index = 0;
  worst_node_index = 1;
  uVar3 = vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_>::size(&this->m_training_vecs);
  vector<unsigned_int>::reserve(&this->m_left_children,uVar3 + 1);
  uVar3 = vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_>::size(&this->m_training_vecs);
  vector<unsigned_int>::reserve(&this->m_right_children,uVar3 + 1);
  cur_percentage = -1;
  do {
    bVar2 = false;
    if ((uint)worst_node_index < max_size) {
      bVar2 = this->m_heap_size != 0;
    }
    if (!bVar2) {
      vector<crnlib::vec<16U,_float>_>::clear(&this->m_codebook);
      this->m_overall_variance = 0.0;
      for (node._4_4_ = 0;
          uVar3 = vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node>::size
                            (&this->m_nodes), node._4_4_ < uVar3; node._4_4_ = node._4_4_ + 1) {
        obj = vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                        (&this->m_nodes,node._4_4_);
        if (obj->m_left == -1) {
          uVar3 = vector<crnlib::vec<16U,_float>_>::size(&this->m_codebook);
          obj->m_codebook_index = uVar3;
          vector<crnlib::vec<16U,_float>_>::push_back(&this->m_codebook,&obj->m_centroid);
          this->m_overall_variance = obj->m_variance + this->m_overall_variance;
        }
      }
      vector<unsigned_int>::clear(&this->m_heap);
      vector<unsigned_int>::clear(&this->m_left_children);
      vector<unsigned_int>::clear(&this->m_right_children);
      this_local._7_1_ = true;
      goto LAB_00164647;
    }
    puVar6 = vector<unsigned_int>::operator[](&this->m_heap,1);
    uVar3 = *puVar6;
    puVar6 = vector<unsigned_int>::operator[](&this->m_heap,this->m_heap_size);
    uVar4 = *puVar6;
    puVar6 = vector<unsigned_int>::operator[](&this->m_heap,1);
    *puVar6 = uVar4;
    this->m_heap_size = this->m_heap_size - 1;
    if (this->m_heap_size != 0) {
      down_heap(this,1);
    }
    split_node(this,uVar3);
    worst_node_index = worst_node_index + 1;
  } while ((((pProgress_callback == (progress_callback_func_ptr)0x0) ||
            ((worst_node_index & 0x3fU) != 0)) || (max_size == 0)) ||
          ((uVar4 = (worst_node_index * 100 + (max_size >> 1)) / max_size, uVar4 == cur_percentage
           || (bVar2 = (*pProgress_callback)(uVar4,pProgress_data), cur_percentage = uVar4, bVar2)))
          );
  this_local._7_1_ = false;
LAB_00164647:
  vq_node::~vq_node((vq_node *)local_b0);
  return this_local._7_1_;
}

Assistant:

bool generate_codebook(uint max_size, progress_callback_func_ptr pProgress_callback = nullptr, void* pProgress_data = nullptr, bool quick = false)
        {
            if (m_training_vecs.empty())
            {
                return false;
            }

            m_quick = quick;

            double ttsum = 0.0f;

            vq_node root;
            root.m_vectors.reserve(m_training_vecs.size());

            for (uint i = 0; i < m_training_vecs.size(); i++)
            {
                const VectorType& v = m_training_vecs[i].first;
                const uint weight = m_training_vecs[i].second;

                root.m_centroid += (v * (float)weight);
                root.m_total_weight += weight;
                root.m_vectors.push_back(i);

                ttsum += v.dot(v) * weight;
            }

            root.m_variance = (float)(ttsum - (root.m_centroid.dot(root.m_centroid) / root.m_total_weight));

            root.m_centroid *= (1.0f / root.m_total_weight);

            m_nodes.clear();
            m_nodes.reserve(max_size * 2 + 1);

            m_nodes.push_back(root);

            m_heap.resize(max_size + 1);
            m_heap[1] = 0;
            m_heap_size = 1;

            m_split_index = 0;

            uint total_leaves = 1;

            m_left_children.reserve(m_training_vecs.size() + 1);
            m_right_children.reserve(m_training_vecs.size() + 1);

            int prev_percentage = -1;
            while ((total_leaves < max_size) && (m_heap_size))
            {
                int worst_node_index = m_heap[1];

                m_heap[1] = m_heap[m_heap_size];
                m_heap_size--;
                if (m_heap_size)
                {
                    down_heap(1);
                }

                split_node(worst_node_index);
                total_leaves++;

                if ((pProgress_callback) && ((total_leaves & 63) == 0) && (max_size))
                {
                    int cur_percentage = (total_leaves * 100U + (max_size / 2U)) / max_size;
                    if (cur_percentage != prev_percentage)
                    {
                        if (!(*pProgress_callback)(cur_percentage, pProgress_data))
                        {
                            return false;
                        }

                        prev_percentage = cur_percentage;
                    }
                }
            }

            m_codebook.clear();

            m_overall_variance = 0.0f;

            for (uint i = 0; i < m_nodes.size(); i++)
            {
                vq_node& node = m_nodes[i];
                if (node.m_left != -1)
                {
                    CRNLIB_ASSERT(node.m_right != -1);
                    continue;
                }

                CRNLIB_ASSERT((node.m_left == -1) && (node.m_right == -1));

                node.m_codebook_index = m_codebook.size();
                m_codebook.push_back(node.m_centroid);

                m_overall_variance += node.m_variance;
            }

            m_heap.clear();
            m_left_children.clear();
            m_right_children.clear();

            return true;
        }